

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_test.cpp
# Opt level: O0

void addGlobal(void)

{
  int iVar1;
  int val;
  LockGuard lock;
  int i;
  
  lock.m_mutex._4_4_ = 0;
  while (lock.m_mutex._4_4_ < 200) {
    LockGuard::LockGuard((LockGuard *)&stack0xffffffffffffffe8,&mutex);
    iVar1 = globalVal + 1;
    usleep(1);
    lock.m_mutex._4_4_ = lock.m_mutex._4_4_ + 1;
    globalVal = iVar1;
    LockGuard::~LockGuard((LockGuard *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void addGlobal()
{
	int i = 0;
	while(i < 200)
	{
		LockGuard lock(mutex);
		int val = globalVal;
		val += 1;
		usleep(1);
		globalVal = val;
		++i;
	}
}